

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

wchar_t map_bind(EditLine *el,wchar_t argc,wchar_t **argv)

{
  el_bindings_t *peVar1;
  el_action_t *peVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  wchar_t wVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  keymacro_value_t *pkVar10;
  wint_t wVar11;
  char *__format;
  FILE *__stream;
  wchar_t **ppwVar12;
  long lVar13;
  el_bindings_t *peVar14;
  wchar_t outbuf [1024];
  wchar_t inbuf [1024];
  el_action_t *local_2050;
  wchar_t local_2038 [1024];
  wchar_t local_1038 [1026];
  
  wVar7 = L'\xffffffff';
  if (argv != (wchar_t **)0x0) {
    pwVar8 = argv[1];
    if (pwVar8 != (wchar_t *)0x0) {
      local_2050 = (el->el_map).key;
      ppwVar12 = argv + 2;
      bVar4 = false;
      bVar6 = false;
      bVar5 = false;
      do {
        if (*pwVar8 != L'-') {
          if (bVar4) {
            if (bVar5) {
              terminal_clear_arrow(el,pwVar8);
              return L'\xffffffff';
            }
            pwVar9 = *ppwVar12;
            if (pwVar9 == (wchar_t *)0x0) goto LAB_0011c04b;
          }
          else {
            pwVar8 = parse__string(local_1038,pwVar8);
            if (pwVar8 == (wchar_t *)0x0) {
              __stream = (FILE *)el->el_errfile;
              pwVar8 = *argv;
              __format = "%ls: Invalid \\ or ^ in instring.\n";
              goto LAB_0011c1fb;
            }
            if (bVar5) {
              if ((pwVar8[1] == L'\0') && (local_2050[(byte)*pwVar8] != '\x19')) {
                local_2050[(byte)*pwVar8] = '\x1c';
              }
              else {
                keymacro_delete(el,pwVar8);
              }
              goto LAB_0011c050;
            }
            pwVar9 = *ppwVar12;
            if (pwVar9 == (wchar_t *)0x0) {
              map_print_key(el,local_2050,pwVar8);
              goto LAB_0011c050;
            }
          }
          if (bVar6) {
            pwVar9 = parse__string(local_2038,pwVar9);
            if (pwVar9 == (wchar_t *)0x0) {
              __stream = (FILE *)el->el_errfile;
              pwVar8 = *argv;
              __format = "%ls: Invalid \\ or ^ in outstring.\n";
LAB_0011c1fb:
              fprintf(__stream,__format,pwVar8);
              return L'\xffffffff';
            }
            pkVar10 = keymacro_map_str(el,pwVar9);
            if (bVar4) {
              terminal_set_arrow(el,pwVar8,pkVar10,L'\x01');
            }
            else {
              keymacro_add(el,pwVar8,pkVar10,L'\x01');
            }
            local_2050[(byte)*pwVar8] = '\x19';
          }
          else {
            wVar7 = parse_cmd(el,pwVar9);
            if (wVar7 == L'\xffffffff') {
              fprintf((FILE *)el->el_errfile,"%ls: Invalid command `%ls\'.\n",*argv,*ppwVar12);
              return L'\xffffffff';
            }
            if (bVar4) {
              pkVar10 = keymacro_map_cmd(el,wVar7);
              terminal_set_arrow(el,pwVar8,pkVar10,L'\0');
              return L'\0';
            }
            if (pwVar8[1] != L'\0') {
              pkVar10 = keymacro_map_cmd(el,wVar7);
              keymacro_add(el,pwVar8,pkVar10,L'\0');
              local_2050[(byte)*pwVar8] = '\x19';
              return L'\0';
            }
            keymacro_clear(el,local_2050,pwVar8);
            local_2050[(byte)*pwVar8] = (el_action_t)wVar7;
          }
          goto LAB_0011c050;
        }
        wVar7 = pwVar8[1];
        switch(wVar7) {
        case L'k':
          bVar4 = true;
          break;
        case L'l':
          sVar3 = (el->el_map).nfunc;
          if (0 < (long)sVar3) {
            peVar14 = (el->el_map).help;
            peVar1 = peVar14 + sVar3;
            do {
              fprintf((FILE *)el->el_outfile,"%ls\n\t%ls\n",peVar14->name,peVar14->description);
              peVar14 = peVar14 + 1;
            } while (peVar14 < peVar1);
            return L'\0';
          }
          goto LAB_0011c050;
        case L'm':
        case L'n':
        case L'o':
        case L'p':
        case L'q':
        case L't':
        case L'u':
switchD_0011bede_caseD_6d:
          fprintf((FILE *)el->el_errfile,"%ls: Invalid switch `%lc\'.\n",*argv);
          break;
        case L'r':
          bVar5 = true;
          break;
        case L's':
          bVar6 = true;
          break;
        case L'v':
          map_init_vi(el);
          goto LAB_0011c050;
        default:
          if (wVar7 != L'a') {
            if (wVar7 != L'e') goto switchD_0011bede_caseD_6d;
            map_init_emacs(el);
            goto LAB_0011c050;
          }
          local_2050 = (el->el_map).alt;
        }
        pwVar8 = *ppwVar12;
        ppwVar12 = ppwVar12 + 1;
      } while (pwVar8 != (wchar_t *)0x0);
    }
    fwrite("Standard key bindings\n",0x16,1,(FILE *)el->el_outfile);
    lVar13 = 0;
    wVar11 = 0;
    do {
      peVar2 = (el->el_map).key;
      if (peVar2[(int)wVar11] != peVar2[lVar13]) {
        map_print_some_keys(el,peVar2,wVar11,(wint_t)lVar13 - 1);
        wVar11 = (wint_t)lVar13;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x100);
    map_print_some_keys(el,(el->el_map).key,wVar11,0xff);
    fwrite("Alternative key bindings\n",0x19,1,(FILE *)el->el_outfile);
    lVar13 = 0;
    wVar11 = 0;
    do {
      peVar2 = (el->el_map).alt;
      if (peVar2[(int)wVar11] != peVar2[lVar13]) {
        map_print_some_keys(el,peVar2,wVar11,(wint_t)lVar13 - 1);
        wVar11 = (wint_t)lVar13;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x100);
    map_print_some_keys(el,(el->el_map).alt,wVar11,0xff);
    fwrite("Multi-character bindings\n",0x19,1,(FILE *)el->el_outfile);
    keymacro_print(el,anon_var_dwarf_247de + 3);
    fwrite("Arrow key bindings\n",0x13,1,(FILE *)el->el_outfile);
    pwVar8 = anon_var_dwarf_247de + 3;
LAB_0011c04b:
    terminal_print_arrow(el,pwVar8);
LAB_0011c050:
    wVar7 = L'\0';
  }
  return wVar7;
}

Assistant:

libedit_private int
map_bind(EditLine *el, int argc, const wchar_t **argv)
{
	el_action_t *map;
	int ntype, rem;
	const wchar_t *p;
	wchar_t inbuf[EL_BUFSIZ];
	wchar_t outbuf[EL_BUFSIZ];
	const wchar_t *in = NULL;
	wchar_t *out;
	el_bindings_t *bp, *ep;
	int cmd;
	int key;

	if (argv == NULL)
		return -1;

	map = el->el_map.key;
	ntype = XK_CMD;
	key = rem = 0;
	for (argc = 1; (p = argv[argc]) != NULL; argc++)
		if (p[0] == '-')
			switch (p[1]) {
			case 'a':
				map = el->el_map.alt;
				break;

			case 's':
				ntype = XK_STR;
				break;
			case 'k':
				key = 1;
				break;

			case 'r':
				rem = 1;
				break;

			case 'v':
				map_init_vi(el);
				return 0;

			case 'e':
				map_init_emacs(el);
				return 0;

			case 'l':
				ep = &el->el_map.help[el->el_map.nfunc];
				for (bp = el->el_map.help; bp < ep; bp++)
					(void) fprintf(el->el_outfile,
					    "%ls\n\t%ls\n",
					    bp->name, bp->description);
				return 0;
			default:
				(void) fprintf(el->el_errfile,
				    "%ls: Invalid switch `%lc'.\n",
				    argv[0], (wint_t)p[1]);
			}
		else
			break;

	if (argv[argc] == NULL) {
		map_print_all_keys(el);
		return 0;
	}
	if (key)
		in = argv[argc++];
	else if ((in = parse__string(inbuf, argv[argc++])) == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Invalid \\ or ^ in instring.\n",
		    argv[0]);
		return -1;
	}
	if (rem) {
		if (key) {
			(void) terminal_clear_arrow(el, in);
			return -1;
		}
		if (in[1])
			(void) keymacro_delete(el, in);
		else if (map[(unsigned char) *in] == ED_SEQUENCE_LEAD_IN)
			(void) keymacro_delete(el, in);
		else
			map[(unsigned char) *in] = ED_UNASSIGNED;
		return 0;
	}
	if (argv[argc] == NULL) {
		if (key)
			terminal_print_arrow(el, in);
		else
			map_print_key(el, map, in);
		return 0;
	}
#ifdef notyet
	if (argv[argc + 1] != NULL) {
		bindkeymacro_usage();
		return -1;
	}
#endif

	switch (ntype) {
	case XK_STR:
		if ((out = parse__string(outbuf, argv[argc])) == NULL) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid \\ or ^ in outstring.\n", argv[0]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_str(el, out), ntype);
		else
			keymacro_add(el, in, keymacro_map_str(el, out), ntype);
		map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
		break;

	case XK_CMD:
		if ((cmd = parse_cmd(el, argv[argc])) == -1) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid command `%ls'.\n",
			    argv[0], argv[argc]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_cmd(el, cmd), ntype);
		else {
			if (in[1]) {
				keymacro_add(el, in, keymacro_map_cmd(el, cmd), ntype);
				map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
			} else {
				keymacro_clear(el, map, in);
				map[(unsigned char) *in] = (el_action_t)cmd;
			}
		}
		break;

	/* coverity[dead_error_begin] */
	default:
		EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
		break;
	}
	return 0;
}